

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O1

void __thiscall OmegaSN::~OmegaSN(OmegaSN *this)

{
  pointer pdVar1;
  pointer piVar2;
  uint i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (this->states != (double *)0x0) {
    operator_delete(this->states);
  }
  this->states = (double *)0x0;
  lVar3 = 0;
  do {
    if (this->S12P[lVar3] != (double *)0x0) {
      operator_delete(this->S12P[lVar3]);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  if (this->S12P != (double **)0x0) {
    operator_delete__(this->S12P);
  }
  this->S12P = (double **)0x0;
  if (this->nbSegments != 0) {
    uVar4 = 0;
    do {
      if (this->nbStates != 0) {
        uVar5 = 0;
        do {
          if (this->Q[uVar4][uVar5] != (double *)0x0) {
            operator_delete(this->Q[uVar4][uVar5]);
          }
          if (this->lastChpt[uVar4][uVar5] != (uint *)0x0) {
            operator_delete(this->lastChpt[uVar4][uVar5]);
          }
          if (this->lastIndState[uVar4][uVar5] != (uint *)0x0) {
            operator_delete(this->lastIndState[uVar4][uVar5]);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 < this->nbStates);
      }
      if (this->Q[uVar4] != (double **)0x0) {
        operator_delete(this->Q[uVar4]);
      }
      if (this->lastChpt[uVar4] != (uint **)0x0) {
        operator_delete(this->lastChpt[uVar4]);
      }
      if (this->lastIndState[uVar4] != (uint **)0x0) {
        operator_delete(this->lastIndState[uVar4]);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->nbSegments);
  }
  if (this->Q != (double ***)0x0) {
    operator_delete__(this->Q);
  }
  if (this->lastChpt != (uint ***)0x0) {
    operator_delete__(this->lastChpt);
  }
  if (this->lastIndState != (uint ***)0x0) {
    operator_delete__(this->lastIndState);
  }
  this->Q = (double ***)0x0;
  this->lastIndState = (uint ***)0x0;
  this->lastChpt = (uint ***)0x0;
  pdVar1 = (this->parameters).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  piVar2 = (this->changepoints).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

OmegaSN::~OmegaSN()
{
  delete(states);
  states = NULL;
  for(unsigned int i = 0; i < 3; i++){delete(S12P[i]);}
  delete [] S12P;
  S12P = NULL;

  for(unsigned int i = 0; i < nbSegments; i++)
  {
    for(unsigned int j = 0; j < nbStates; j++)
    {
      delete(Q[i][j]);
      delete(lastChpt[i][j]);
      delete(lastIndState[i][j]);
      }
    delete(Q[i]);
    delete(lastChpt[i]);
    delete(lastIndState[i]);
  }
  delete [] Q;
  delete [] lastChpt;
  delete [] lastIndState;
  Q = NULL;
  lastChpt = NULL;
  lastIndState = NULL;
}